

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  long *plVar1;
  byte bVar2;
  pointer paVar3;
  clock_t cVar4;
  ostream *poVar5;
  void *pvVar6;
  ulong uVar7;
  long lVar8;
  int p;
  pointer paVar9;
  long lVar10;
  int i;
  vector<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_> cache;
  vector<unsigned_long,_std::allocator<unsigned_long>_> offsets;
  uint32_t x_1;
  uint64_t sum;
  vector<unsigned_long,_std::allocator<unsigned_long>_> offsets2;
  ifstream f;
  fstream of;
  vector<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
  local_4b8;
  void *local_4a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_498;
  uint local_474;
  long local_470;
  unsigned_long local_468;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_460;
  long local_448 [4];
  byte abStack_428 [488];
  char local_240 [2];
  ushort local_23e;
  char local_230 [512];
  
  std::ifstream::ifstream(local_448,"input",_S_bin);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"detect pool sizes...\t",0x15);
  local_4a0 = operator_new(0x100000);
  memset(local_4a0,0,0x100000);
  if ((abStack_428[*(long *)(local_448[0] + -0x18)] & 2) == 0) {
    do {
      std::istream::read((char *)local_448,(long)local_240);
      if ((abStack_428[*(long *)(local_448[0] + -0x18)] & 5) == 0) {
        plVar1 = (long *)((long)local_4a0 + (ulong)local_23e * 8);
        *plVar1 = *plVar1 + 1;
      }
    } while ((abStack_428[*(long *)(local_448[0] + -0x18)] & 2) == 0);
  }
  local_498.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_498.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_498.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_498,0x20000);
  local_468 = 0;
  lVar8 = 0;
  do {
    lVar10 = *(long *)((long)local_4a0 + lVar8);
    if (local_498.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_498.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_498,
                 (iterator)
                 local_498.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish,&local_468);
    }
    else {
      *local_498.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish = local_468;
      local_498.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_498.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_468 = local_468 + lVar10 * 4;
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x100000);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_460,&local_498);
  cVar4 = clock();
  lVar8 = cVar4 - gClock;
  gClock = cVar4;
  poVar5 = std::ostream::_M_insert<double>((double)lVar8 / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"write unsorted...\t",0x12);
  std::fstream::fstream(local_240,"output",_S_trunc|_S_out|_S_in|_S_bin);
  pvVar6 = operator_new(0x20000);
  memset(pvVar6,0,0x20000);
  local_4b8.
  super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4b8.
  super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4b8.
  super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>::
  resize(&local_4b8,0x20000);
  std::ios::clear((int)local_448 + (int)*(undefined8 *)(local_448[0] + -0x18));
  std::istream::seekg((long)local_448,_S_beg);
  if ((abStack_428[*(long *)(local_448[0] + -0x18)] & 2) == 0) {
    do {
      std::istream::read((char *)local_448,(long)&local_474);
      if ((abStack_428[*(long *)(local_448[0] + -0x18)] & 5) == 0) {
        uVar7 = (ulong)(local_474 >> 0x10);
        paVar9 = local_4b8.
                 super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar7;
        bVar2 = *(byte *)((long)pvVar6 + uVar7);
        if ((ulong)bVar2 == 0xff) {
          paVar9[1]._M_elems[0x10] = local_474;
          std::ostream::seekp(local_230,
                              local_498.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar7],0);
          std::ostream::write(local_230,(long)paVar9);
          local_498.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar7] =
               local_498.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7] + 0x3bc;
          *(undefined1 *)((long)pvVar6 + uVar7) = 0;
        }
        else {
          *(byte *)((long)pvVar6 + uVar7) = bVar2 + 1;
          paVar9->_M_elems[bVar2] = local_474;
        }
      }
    } while ((abStack_428[*(long *)(local_448[0] + -0x18)] & 2) == 0);
  }
  cVar4 = clock();
  lVar8 = cVar4 - gClock;
  gClock = cVar4;
  poVar5 = std::ostream::_M_insert<double>((double)lVar8 / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"write remaining pools...\t",0x19);
  lVar8 = 0;
  lVar10 = 0;
  do {
    paVar9 = local_4b8.
             super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (*(char *)((long)pvVar6 + lVar10) != '\0') {
      std::ostream::seekp(local_230,
                          local_498.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar10],0);
      std::ostream::write(local_230,(long)paVar9->_M_elems + lVar8);
    }
    lVar10 = lVar10 + 1;
    lVar8 = lVar8 + 0x3bc;
  } while (lVar10 != 0x20000);
  if (local_4b8.
      super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4b8.
                    super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_4b8.
                          super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4b8.
                          super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  operator_delete(pvVar6,0x20000);
  cVar4 = clock();
  lVar8 = cVar4 - gClock;
  gClock = cVar4;
  poVar5 = std::ostream::_M_insert<double>((double)lVar8 / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"sort separate pools...\t",0x17);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&local_498,&local_460);
  lVar8 = 0;
  do {
    uVar7 = *(ulong *)((long)local_4a0 + lVar8 * 8);
    if (uVar7 < 0x20000) {
      local_4b8.
      super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_4b8.
      super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_4b8.
      super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_4b8,uVar7);
      std::istream::seekg((long)local_240,
                          (_Ios_Seekdir)
                          local_498.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar8]);
      std::istream::read(local_240,
                         (long)local_4b8.
                               super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
      paVar3 = local_4b8.
               super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      paVar9 = local_4b8.
               super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_4b8.
          super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_4b8.
          super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar7 = (long)local_4b8.
                      super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_4b8.
                      super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 2;
        lVar10 = 0x3f;
        if (uVar7 != 0) {
          for (; uVar7 >> lVar10 == 0; lVar10 = lVar10 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_4b8.
                   super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_4b8.
                   super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (paVar9,paVar3);
      }
      std::ostream::seekp((long)local_230,
                          (_Ios_Seekdir)
                          local_498.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar8]);
      std::ostream::write(local_230,
                          (long)local_4b8.
                                super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
      if (local_4b8.
          super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4b8.
                        super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_4b8.
                              super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_4b8.
                              super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      pvVar6 = operator_new(0x100000);
      memset(pvVar6,0,0x100000);
      std::istream::seekg((long)local_240,
                          (_Ios_Seekdir)
                          local_498.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar8]);
      lVar10 = *(long *)((long)local_4a0 + lVar8 * 8);
      for (; local_470 = lVar8, lVar10 != 0; lVar10 = lVar10 + -1) {
        std::istream::read(local_240,(long)&local_4b8);
        plVar1 = (long *)((long)pvVar6 +
                         (ulong)((uint)local_4b8.
                                       super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start & 0x1ffff) * 8);
        *plVar1 = *plVar1 + 1;
        lVar8 = local_470;
      }
      std::ostream::seekp((long)local_230,
                          (_Ios_Seekdir)
                          local_498.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar8]);
      lVar10 = 0;
      do {
        local_4b8.
        super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_4b8.
                               super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                               (int)lVar8 << 0x10 | (uint)lVar10);
        if (*(long *)((long)pvVar6 + lVar10 * 8) != 0) {
          uVar7 = 0;
          do {
            std::ostream::write(local_230,(long)&local_4b8);
            uVar7 = uVar7 + 1;
          } while (uVar7 < *(ulong *)((long)pvVar6 + lVar10 * 8));
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x20000);
      operator_delete(pvVar6,0x100000);
      lVar8 = local_470;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x20000);
  cVar4 = clock();
  lVar8 = cVar4 - gClock;
  gClock = cVar4;
  poVar5 = std::ostream::_M_insert<double>((double)lVar8 / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::fstream::close();
  std::fstream::~fstream(local_240);
  if (local_460.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_460.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_460.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_460.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_498.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_498.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_498.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_498.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  operator_delete(local_4a0,0x100000);
  std::ifstream::~ifstream(local_448);
  return 0;
}

Assistant:

int main(){
    ifstream f("input", std::ios::binary);

    cerr << "detect pool sizes...\t";

    const size_t bits_per_pool = 16;
    const size_t pools_count = 2<<(32-bits_per_pool);
    vector<uint64_t> poolsize(pools_count, 0);

    while(!f.eof()) {
        uint32_t x;
        f.read((char*)&x, sizeof(x));
        if(f) {
            poolsize[x >> bits_per_pool]++;
        }
    }

    vector<uint64_t> offsets;
    offsets.reserve(pools_count);

    uint64_t sum=0;
    for(auto x: poolsize) {
        offsets.push_back(sum);
        sum+= x*4;
    }

    vector<uint64_t> offsets2(offsets);

    cerr << relClockOffset() << "\n";
    cerr << "write unsorted...\t";

    const uint64_t mem = 128'000'000 -
            pools_count*8 /*poolsize*/ -
            2*pools_count*4 /*offsets*/;

    //STAGE 2

    fstream of("output", std::ios::binary | std::ios::out | std::ios::in | std::ios::trunc);

    {
        vector<uint8_t> wrt_offset(pools_count, 0);

        const uint64_t mem2 = mem - pools_count*1 /*wrt_offset*/;

        const size_t max_line = mem2/pools_count/4; //256;
        vector<array<uint32_t, max_line> > cache;
        cache.resize(pools_count);

        f.clear();
        f.seekg(0, ios::beg);

        while (!f.eof()) {
            uint32_t x;
            f.read((char *) &x, sizeof(x));
            if (f) {
                size_t pool = x >> bits_per_pool;

                auto &cl = cache[pool];
                uint8_t &offs = wrt_offset[pool];
                if (offs == numeric_limits<uint8_t>::max()) {
                    cl[offs] = x;
                    of.seekp(offsets[pool]);
                    of.write((char *) &cl, 4 * max_line);
                    offsets[pool] += 4 * max_line;
                    offs = 0;
                } else {
                    cl[offs++] = x;
                }
            }
        }

        cerr << relClockOffset() << "\n";
        cerr << "write remaining pools...\t";

        for (int p = 0; p < pools_count; p++) {
            uint8_t offs = wrt_offset[p];
            if (offs > 0) {
                auto &cl = cache[p];
                of.seekp(offsets[p]);
                of.write((char *) &cl, 4 * (offs));
            }
        }
    }

    cerr << relClockOffset() << "\n";
    cerr << "sort separate pools...\t";

    //STAGE 3

    offsets = offsets2;
//    offsets2.clear();
//    offsets2.shrink_to_fit();
//    const size_t mem3 = mem - pools_count*4 /*offsets*/;

    for(size_t p =0;p<pools_count;p++) {
        if(poolsize[p] < 2<<bits_per_pool) {
            vector<uint32_t > arr(0);
            arr.resize(poolsize[p]);
            of.seekg(offsets[p], ios::beg);
            of.read((char*)arr.data(), arr.size()*4);
            sort(arr.begin(), arr.end());
            of.seekp(offsets[p], ios::beg);
            of.write((char*)arr.data(), arr.size()*4);
        } else {
            vector<uint64_t> cntsrt(2 << bits_per_pool, 0);
            of.seekg(offsets[p], ios::beg);
            size_t cnt = poolsize[p];
            for (int i = 0; i < cnt; i++) {
                uint32_t x;
                of.read((char *) &x, 4);
                cntsrt[x & ((2<<bits_per_pool)-1) ]++;
            }
            of.seekp(offsets[p], ios::beg);
            for (int i = 0; i < 2 << bits_per_pool; i++) {
                uint32_t x = (p << bits_per_pool) | i;
                for (int z = 0; z < cntsrt[i]; z++) {
                    of.write((char *) &x, 4);
                }
            }
        }
    }

    cerr << relClockOffset() << "\n";

    of.close();
}